

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IPAddress.h
# Opt level: O2

string * __thiscall
jaegertracing::net::IPAddress::host_abi_cxx11_(string *__return_storage_ptr__,IPAddress *this)

{
  int __af;
  char *pcVar1;
  char *pcVar2;
  allocator local_3f;
  array<char,_46UL> buffer;
  
  __af = family(this);
  pcVar1 = inet_ntop(__af,(this->_addr).__ss_padding + (ulong)(__af != 2) * 4 + 2,buffer._M_elems,
                     0x2e);
  pcVar2 = "";
  if (pcVar1 != (char *)0x0) {
    pcVar2 = pcVar1;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,&local_3f);
  return __return_storage_ptr__;
}

Assistant:

std::string host() const
    {
        std::array<char, INET6_ADDRSTRLEN> buffer;
        const auto af = family();
        const auto* addrStr = ::inet_ntop(
            af,
            af == AF_INET
                ? const_cast<void*>(
                    static_cast<const void*>(
                        &reinterpret_cast<const ::sockaddr_in&>(_addr).sin_addr))
                : const_cast<void*>(
                    static_cast<const void*>(
                        &reinterpret_cast<const ::sockaddr_in6&>(_addr).sin6_addr)),
            &buffer[0],
            buffer.size());
        return addrStr ? addrStr : "";
    }